

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_copyBlockSequences
                 (SeqCollector *seqCollector,seqStore_t *seqStore,U32 *prevRepcodes)

{
  uint uVar1;
  long lVar2;
  undefined8 *in_RDX;
  long *in_RSI;
  long in_RDI;
  size_t lastLLSize;
  U32 repcode;
  U32 rawOffset;
  size_t i;
  repcodes_t repcodes;
  size_t nbOutLiterals;
  size_t nbOutSequences;
  ZSTD_Sequence *outSeqs;
  size_t nbInLiterals;
  size_t nbInSequences;
  seqDef *inSeqs;
  long local_80;
  int local_6c;
  ulong local_68;
  undefined8 local_5c;
  undefined4 local_54;
  long local_50;
  ulong local_48;
  long local_40;
  long local_38;
  ulong local_30;
  long local_28;
  long *local_18;
  long local_10;
  size_t local_8;
  
  local_28 = *in_RSI;
  local_30 = in_RSI[1] - *in_RSI >> 3;
  local_38 = in_RSI[3] - in_RSI[2];
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_80 = *(long *)(in_RDI + 8);
  }
  else {
    local_80 = *(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x10) * 0x10;
  }
  local_40 = local_80;
  local_48 = local_30 + 1;
  local_50 = 0;
  if ((ulong)(*(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x10)) < local_48) {
    local_8 = 0xffffffffffffffba;
  }
  else {
    local_5c = *in_RDX;
    local_54 = *(undefined4 *)(in_RDX + 1);
    local_18 = in_RSI;
    local_10 = in_RDI;
    for (local_68 = 0; local_68 < local_30; local_68 = local_68 + 1) {
      *(uint *)(local_40 + local_68 * 0x10 + 4) = (uint)*(ushort *)(local_28 + 4 + local_68 * 8);
      *(uint *)(local_40 + local_68 * 0x10 + 8) = *(ushort *)(local_28 + 6 + local_68 * 8) + 3;
      *(undefined4 *)(local_40 + local_68 * 0x10 + 0xc) = 0;
      if (local_68 == *(uint *)((long)local_18 + 0x4c)) {
        if ((int)local_18[9] == 1) {
          lVar2 = local_40 + local_68 * 0x10;
          *(int *)(lVar2 + 4) = *(int *)(lVar2 + 4) + 0x10000;
        }
        else if ((int)local_18[9] == 2) {
          lVar2 = local_40 + local_68 * 0x10;
          *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 0x10000;
        }
      }
      if ((*(int *)(local_28 + local_68 * 8) == 0) || (3 < *(uint *)(local_28 + local_68 * 8))) {
        local_6c = *(int *)(local_28 + local_68 * 8) + -3;
      }
      else {
        uVar1 = *(uint *)(local_28 + local_68 * 8);
        *(uint *)(local_40 + local_68 * 0x10 + 0xc) = uVar1;
        if (*(int *)(local_40 + local_68 * 0x10 + 4) == 0) {
          if (uVar1 == 3) {
            local_6c = (U32)local_5c - 1;
          }
          else {
            local_6c = *(int *)((long)&local_5c + (ulong)uVar1 * 4);
          }
        }
        else {
          local_6c = *(int *)((long)&local_5c + (ulong)(uVar1 - 1) * 4);
        }
      }
      *(int *)(local_40 + local_68 * 0x10) = local_6c;
      ZSTD_updateRep((U32 *)&local_5c,*(U32 *)(local_28 + local_68 * 8),
                     (uint)(*(short *)(local_28 + 4 + local_68 * 8) == 0));
      local_50 = (ulong)*(uint *)(local_40 + local_68 * 0x10 + 4) + local_50;
    }
    *(int *)(local_40 + local_30 * 0x10 + 4) = (int)local_38 - (int)local_50;
    *(undefined4 *)(local_40 + local_30 * 0x10 + 8) = 0;
    *(undefined4 *)(local_40 + local_30 * 0x10) = 0;
    *(ulong *)(local_10 + 0x10) = local_48 + *(long *)(local_10 + 0x10);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static size_t ZSTD_copyBlockSequences(SeqCollector* seqCollector, const seqStore_t* seqStore, const U32 prevRepcodes[ZSTD_REP_NUM])
{
    const seqDef* inSeqs = seqStore->sequencesStart;
    const size_t nbInSequences = seqStore->sequences - inSeqs;
    const size_t nbInLiterals = (size_t)(seqStore->lit - seqStore->litStart);

    ZSTD_Sequence* outSeqs = seqCollector->seqIndex == 0 ? seqCollector->seqStart : seqCollector->seqStart + seqCollector->seqIndex;
    const size_t nbOutSequences = nbInSequences + 1;
    size_t nbOutLiterals = 0;
    repcodes_t repcodes;
    size_t i;

    /* Bounds check that we have enough space for every input sequence
     * and the block delimiter
     */
    assert(seqCollector->seqIndex <= seqCollector->maxSequences);
    RETURN_ERROR_IF(
        nbOutSequences > (size_t)(seqCollector->maxSequences - seqCollector->seqIndex),
        dstSize_tooSmall,
        "Not enough space to copy sequences");

    ZSTD_memcpy(&repcodes, prevRepcodes, sizeof(repcodes));
    for (i = 0; i < nbInSequences; ++i) {
        U32 rawOffset;
        outSeqs[i].litLength = inSeqs[i].litLength;
        outSeqs[i].matchLength = inSeqs[i].mlBase + MINMATCH;
        outSeqs[i].rep = 0;

        /* Handle the possible single length >= 64K
         * There can only be one because we add MINMATCH to every match length,
         * and blocks are at most 128K.
         */
        if (i == seqStore->longLengthPos) {
            if (seqStore->longLengthType == ZSTD_llt_literalLength) {
                outSeqs[i].litLength += 0x10000;
            } else if (seqStore->longLengthType == ZSTD_llt_matchLength) {
                outSeqs[i].matchLength += 0x10000;
            }
        }

        /* Determine the raw offset given the offBase, which may be a repcode. */
        if (OFFBASE_IS_REPCODE(inSeqs[i].offBase)) {
            const U32 repcode = OFFBASE_TO_REPCODE(inSeqs[i].offBase);
            assert(repcode > 0);
            outSeqs[i].rep = repcode;
            if (outSeqs[i].litLength != 0) {
                rawOffset = repcodes.rep[repcode - 1];
            } else {
                if (repcode == 3) {
                    assert(repcodes.rep[0] > 1);
                    rawOffset = repcodes.rep[0] - 1;
                } else {
                    rawOffset = repcodes.rep[repcode];
                }
            }
        } else {
            rawOffset = OFFBASE_TO_OFFSET(inSeqs[i].offBase);
        }
        outSeqs[i].offset = rawOffset;

        /* Update repcode history for the sequence */
        ZSTD_updateRep(repcodes.rep,
                       inSeqs[i].offBase,
                       inSeqs[i].litLength == 0);

        nbOutLiterals += outSeqs[i].litLength;
    }
    /* Insert last literals (if any exist) in the block as a sequence with ml == off == 0.
     * If there are no last literals, then we'll emit (of: 0, ml: 0, ll: 0), which is a marker
     * for the block boundary, according to the API.
     */
    assert(nbInLiterals >= nbOutLiterals);
    {
        const size_t lastLLSize = nbInLiterals - nbOutLiterals;
        outSeqs[nbInSequences].litLength = (U32)lastLLSize;
        outSeqs[nbInSequences].matchLength = 0;
        outSeqs[nbInSequences].offset = 0;
        assert(nbOutSequences == nbInSequences + 1);
    }
    seqCollector->seqIndex += nbOutSequences;
    assert(seqCollector->seqIndex <= seqCollector->maxSequences);

    return 0;
}